

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O0

void __thiscall enact::OptionalTypename::~OptionalTypename(OptionalTypename *this)

{
  OptionalTypename *this_local;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__OptionalTypename_0016aa50;
  std::__cxx11::string::~string((string *)&this->m_name);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (&this->m_wrappedTypename);
  Typename::~Typename(&this->super_Typename);
  return;
}

Assistant:

~OptionalTypename() override = default;